

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

Matrix<double> * __thiscall
nnad::Matrix<double>::Adjoint(Matrix<double> *__return_storage_ptr__,Matrix<double> *this)

{
  int *Columns;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  Matrix<double> Cofactor;
  int local_60;
  int local_5c;
  Matrix<double> local_58;
  double local_38;
  
  if (this->_Lines != this->_Columns) {
    local_58._0_8_ =
         &local_58._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Adjoint: matrix must be square.","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_58._0_8_,
                        (long)local_58._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(-10);
  }
  Columns = &this->_Columns;
  local_58._Lines = 0xffffffff;
  Matrix(__return_storage_ptr__,&this->_Lines,Columns,&local_58._Lines);
  if (this->_Lines == 1) {
    local_38 = (double)((ulong)local_38 & 0xffffffff00000000);
    local_60 = 0;
    local_58._0_8_ = (pointer *)0x3ff0000000000000;
    SetElement(__return_storage_ptr__,(int *)&local_38,&local_60,(double *)&local_58);
  }
  else {
    local_60 = 0;
    if (0 < this->_Lines) {
      do {
        local_5c = 0;
        if (0 < *Columns) {
          do {
            GetCofactor(&local_58,this,local_60,local_5c);
            iVar2 = local_5c;
            iVar1 = local_60;
            local_38 = Determinant(&local_58);
            local_38 = local_38 * (double)(int)(-(iVar2 + iVar1 & 1U) | 1);
            SetElement(__return_storage_ptr__,&local_5c,&local_60,&local_38);
            if (local_58._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_58._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_58._Matrix.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_58._Matrix.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            local_5c = local_5c + 1;
          } while (local_5c < *Columns);
        }
        local_60 = local_60 + 1;
      } while (local_60 < this->_Lines);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> Adjoint()
    {
      if (_Lines != _Columns)
        Error("Adjoint: matrix must be square.");

      Matrix<T> output{_Lines, _Columns};

      if (_Lines == 1)
        {
          output.SetElement(0,0, T{1});
          return output;
        }
      int sign = 1;

      for (int i = 0; i < _Lines; i++)
        for (int j = 0; j < _Columns; j++)
          {
            // Get cofactor
            Matrix<T> Cofactor = this->GetCofactor(i, j);

            // sign of adj[j][i] positive if sum of row
            // and column indexes is even.
            sign = ((i + j) % 2 == 0) ? 1 : -1;

            // Interchanging rows and columns to get the
            // transpose of the cofactor matrix
            output.SetElement(j, i, (sign) * Cofactor.Determinant());
          }
      return output;
    }